

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  char *pcVar3;
  Logger *pLVar4;
  size_t sVar5;
  char *pcVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view title;
  string_view title_00;
  string_view title_01;
  string msg;
  string local_108;
  string local_e8;
  string local_c8;
  pthread_mutex_t *local_98;
  string local_90;
  string_view local_70;
  Logger *local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  pcVar3 = message._M_str;
  sVar5 = message._M_len;
  local_c8._M_string_length = (size_type)&local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)0x1;
  local_c8.field_2._M_local_buf[0] = '\n';
  pcVar6 = pcVar3;
  local_70 = cmQtAutoGen::GeneratorName(genType);
  local_60 = (Logger *)0x11;
  local_58 = " subprocess error";
  views._M_len = 2;
  views._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_e8,views);
  title._M_str = pcVar6;
  title._M_len = (size_t)local_e8._M_dataplus._M_p;
  HeadLine_abi_cxx11_(&local_108,(Logger *)local_e8._M_string_length,title);
  if (sVar5 == 0) {
    pcVar6 = "\n\n";
  }
  else {
    pcVar6 = "\n\n";
    if (pcVar3[sVar5 - 1] == '\n') {
      pcVar6 = "\n";
    }
  }
  local_70._M_str = (char *)local_c8._M_string_length;
  local_70._M_len = (size_t)local_c8._M_dataplus._M_p;
  local_60 = (Logger *)local_108._M_string_length;
  local_58 = local_108._M_dataplus._M_p;
  local_98 = (pthread_mutex_t *)this;
  local_50 = sVar5;
  local_48 = pcVar3;
  local_40 = strlen(pcVar6);
  views_00._M_len = 4;
  views_00._M_array = &local_70;
  local_38 = pcVar6;
  cmCatViews_abi_cxx11_(&local_90,views_00);
  paVar1 = &local_108.field_2;
  pcVar6 = (char *)local_108._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    pcVar6 = (char *)local_108._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  title_00._M_str = pcVar6;
  title_00._M_len = (size_t)"Command";
  HeadLine_abi_cxx11_(&local_108,(Logger *)0x7,title_00);
  cmQtAutoGen::QuotedCommand(&local_e8,command);
  local_60 = (Logger *)local_e8._M_string_length;
  local_58 = local_e8._M_dataplus._M_p;
  local_50 = 2;
  pcVar6 = "\n\n";
  local_48 = "\n\n";
  views_01._M_len = 3;
  views_01._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_c8,views_01);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_c8._M_dataplus._M_p);
  pLVar4 = (Logger *)local_e8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
    pLVar4 = (Logger *)local_e8._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  title_01._M_str = (char *)pLVar4;
  title_01._M_len = (size_t)"Output";
  HeadLine_abi_cxx11_(&local_108,(Logger *)&DAT_00000006,title_01);
  local_58 = (output->_M_dataplus)._M_p;
  local_60 = (Logger *)output->_M_string_length;
  if ((local_60 != (Logger *)0x0) && (pcVar6 = "\n\n", local_58[(long)local_60 - 1] == '\n')) {
    pcVar6 = "\n";
  }
  local_50 = strlen(pcVar6);
  views_02._M_len = 3;
  views_02._M_array = &local_70;
  local_48 = pcVar6;
  cmCatViews_abi_cxx11_(&local_c8,views_02);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_c8._M_dataplus._M_p);
  __mutex = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  cmSystemTools::Stderr(&local_90);
  pthread_mutex_unlock(__mutex);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}